

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void scaledconvolve_vert_w8
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               InterpKernel *y_filters,int y0_q4,int y_step_q4,int w,int h)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R9D;
  int16_t *y_filter;
  uchar *src_y;
  int in_stack_00000010;
  int y_q4;
  int y;
  undefined4 in_stack_00000054;
  undefined4 in_stack_0000005c;
  undefined4 in_stack_00000064;
  uint8_t *in_stack_00000068;
  undefined4 local_34;
  undefined4 local_30;
  
  local_34 = in_R9D;
  for (local_30 = 0; local_30 < y; local_30 = local_30 + 1) {
    if ((local_34 & 0xf) == 0) {
      memcpy((void *)(in_RDX + local_30 * in_RCX),(void *)(in_RDI + ((int)local_34 >> 4) * in_RSI),
             (long)in_stack_00000010);
    }
    else {
      filter_vert_w8_ssse3
                (in_stack_00000068,CONCAT44(in_stack_00000064,h),
                 (uint8_t *)CONCAT44(in_stack_0000005c,w),
                 (int16_t *)CONCAT44(in_stack_00000054,y_step_q4));
    }
    local_34 = (int)src_y + local_34;
  }
  return;
}

Assistant:

static void scaledconvolve_vert_w8(
    const uint8_t *src, const ptrdiff_t src_stride, uint8_t *const dst,
    const ptrdiff_t dst_stride, const InterpKernel *const y_filters,
    const int y0_q4, const int y_step_q4, const int w, const int h) {
  int y;
  int y_q4 = y0_q4;

  src -= src_stride * (SUBPEL_TAPS / 2 - 1);
  for (y = 0; y < h; ++y) {
    const unsigned char *src_y = &src[(y_q4 >> SUBPEL_BITS) * src_stride];
    const int16_t *const y_filter = y_filters[y_q4 & SUBPEL_MASK];
    if (y_q4 & SUBPEL_MASK) {
      filter_vert_w8_ssse3(src_y, src_stride, &dst[y * dst_stride], y_filter);
    } else {
      memcpy(&dst[y * dst_stride], &src_y[3 * src_stride], w);
    }
    y_q4 += y_step_q4;
  }
}